

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O2

void crossPoint(structure_light *a,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *crossPoint)

{
  int n;
  int iVar1;
  int m;
  int iVar2;
  size_type __n;
  float fVar3;
  reference rVar4;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> cornerlinePoint;
  Vec4f cornerLine;
  Vec4f lightLine;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> cornerPoint;
  undefined1 local_90 [8];
  undefined1 *local_88;
  Size local_80;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> lightcornerPoint;
  _OutputArray local_60;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> lightLinePoint;
  
  for (__n = 0; (long)__n < (long)imageCount; __n = __n + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&a->isRecognize,__n);
    if ((*rVar4._M_p & rVar4._M_mask) != 0) {
      cv::Matx<float,_4,_1>::Matx(&lightLine.super_Matx<float,_4,_1>);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&lightLinePoint,
                 (a->lightPlaneSubpixelImagePoint).
                 super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + __n);
      cornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start._0_4_ = 0x8103000d;
      cornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)&lightLinePoint;
      cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(cornerlinePoint.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0xc2020005);
      cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)&lightLine;
      cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000001;
      cv::fitLine((_InputArray *)&cornerPoint,(_OutputArray *)&cornerlinePoint,2,0.0,0.01,0.01);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&cornerPoint,
                 (a->calibImagePoint).
                 super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + __n);
      cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cv::Matx<float,_4,_1>::Matx(&cornerLine.super_Matx<float,_4,_1>);
      lightcornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      lightcornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lightcornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (iVar2 = 0; iVar2 < patternSize.width; iVar2 = iVar2 + 1) {
        for (iVar1 = 0; iVar1 < patternSize.height; iVar1 = iVar1 + 1) {
          std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                    (&cornerlinePoint,
                     (value_type *)
                     ((long)(patternSize.width * iVar1 + iVar2) * 8 +
                     CONCAT44(cornerPoint.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              cornerPoint.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_)));
        }
        local_80.width = 0;
        local_80.height = 0;
        local_90._0_4_ = -0x7efcfff3;
        local_60.super__InputArray.flags = -0x3dfdfffb;
        local_60.super__InputArray.obj = &cornerLine;
        local_60.super__InputArray.sz.width = 1;
        local_60.super__InputArray.sz.height = 4;
        local_88 = (undefined1 *)&cornerlinePoint;
        cv::fitLine((_InputArray *)local_90,&local_60,2,0.0,0.01,0.01);
        fVar3 = cornerLine.super_Matx<float,_4,_1>.val[1] /
                cornerLine.super_Matx<float,_4,_1>.val[0];
        local_90._4_4_ =
             cornerLine.super_Matx<float,_4,_1>.val[3] -
             cornerLine.super_Matx<float,_4,_1>.val[2] * fVar3;
        local_90._0_4_ =
             ((lightLine.super_Matx<float,_4,_1>.val[3] -
              lightLine.super_Matx<float,_4,_1>.val[2] *
              (lightLine.super_Matx<float,_4,_1>.val[1] / lightLine.super_Matx<float,_4,_1>.val[0]))
             - (float)local_90._4_4_) /
             (fVar3 - lightLine.super_Matx<float,_4,_1>.val[1] /
                      lightLine.super_Matx<float,_4,_1>.val[0]);
        local_90._4_4_ = (float)local_90._0_4_ * fVar3 + (float)local_90._4_4_;
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  (&lightcornerPoint,(value_type *)local_90);
        if (cornerlinePoint.
            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            cornerlinePoint.
            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          cornerlinePoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               cornerlinePoint.
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::push_back(crossPoint,
                  (value_type *)
                  &lightcornerPoint.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&lightcornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&cornerlinePoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&cornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&lightLinePoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    }
  }
  return;
}

Assistant:

void crossPoint(structure_light &a, vector<vector<Point2f>> &crossPoint)
{
    for (int i = 0; i < imageCount; i++)
    {
        if (a.isRecognize[i] == false)
            continue;
        Vec4f lightLine;
        vector<Point2f> lightLinePoint = a.lightPlaneSubpixelImagePoint[i];//取出第i张标定图像 的亚像素光条中心点
        fitLine(lightLinePoint, lightLine, DIST_L2, 0, 1e-2, 1e-2);//将第i张图的 光条中心点进行直线拟合
        vector<Point2f> cornerPoint = a.calibImagePoint[i];//靶标平面上圆形标记中心的点（49个）的二维坐标
        vector<Point2f> cornerlinePoint;//存储某一列的圆形标记的中心
        Vec4f cornerLine;//一列圆标记中心拟合出的直线的参数
        vector<Point2f> lightcornerPoint;//提取出的光条上的点
        //提取光条上的点，思路：取一列（或者一行）圆形标记的中心，拟合成直线，计算拟合出直线和光条的交点
        for (int m = 0; m < patternSize.width; m++)//遍历所有列7次
        {
            for (int n = 0; n < patternSize.height; n++)
            {
                cornerlinePoint.push_back(cornerPoint[n*patternSize.width + m]);//取第m列圆形标记的中心
            }
            fitLine(cornerlinePoint, cornerLine, DIST_L2, 0, 1e-2, 1e-2);//将第m列的圆心拟合成直线
            //求出第m列圆心拟合出来的直线和光条直线的交点
            double k1 = cornerLine[1] / cornerLine[0];
            double b1 = cornerLine[3] - k1*cornerLine[2];
            double k2 = lightLine[1] / lightLine[0];
            double b2 = lightLine[3] - k2*lightLine[2];
            Point2f temp;
            temp.x = (b2 - b1) / (k1 - k2);
            temp.y = k1*temp.x + b1;
            //将交点压入向量
            lightcornerPoint.push_back(temp);
            cornerlinePoint.clear();
        }
        crossPoint.push_back(lightcornerPoint);
    }
}